

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall QPlainTextEditPrivate::updatePlaceholderVisibility(QPlainTextEditPrivate *this)

{
  char cVar1;
  bool bVar2;
  
  cVar1 = this->field_0x348;
  bVar2 = placeHolderTextToBeShown(this);
  if (bVar2 == -1 < cVar1) {
    QWidget::update((this->super_QAbstractScrollAreaPrivate).viewport);
    bVar2 = placeHolderTextToBeShown(this);
    this->field_0x348 = this->field_0x348 & 0x7f | bVar2 << 7;
  }
  return;
}

Assistant:

void QPlainTextEditPrivate::updatePlaceholderVisibility()
{
    // We normally only repaint the part of view that contains text in the
    // document that has changed (in repaintContents). But the placeholder
    // text is not a part of the document, but is drawn on separately. So whenever
    // we either show or hide the placeholder text, we issue a full update.
    if (placeholderTextShown != placeHolderTextToBeShown()) {
        viewport->update();
        placeholderTextShown = placeHolderTextToBeShown();
    }
}